

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall
QTableViewPrivate::trimHiddenSelections(QTableViewPrivate *this,QItemSelectionRange *range)

{
  long in_RDI;
  long in_FS_OFFSET;
  int right;
  int bottom;
  int left;
  int top;
  QModelIndex topLeft;
  QModelIndex bottomRight;
  QItemSelectionRange *in_stack_ffffffffffffff18;
  QItemSelectionRange *pQVar1;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  QModelIndex *topL;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3c;
  undefined1 in_stack_ffffffffffffff3d;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 uVar2;
  bool bVar3;
  undefined1 uVar4;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined1 local_88 [24];
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 local_58 [24];
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_ac = QItemSelectionRange::top((QItemSelectionRange *)0x8b2f2a);
  local_b0 = QItemSelectionRange::left((QItemSelectionRange *)0x8b2f38);
  local_b4 = QItemSelectionRange::bottom((QItemSelectionRange *)0x8b2f46);
  local_b8 = QItemSelectionRange::right((QItemSelectionRange *)0x8b2f54);
  while( true ) {
    bVar3 = false;
    if (local_ac <= local_b4) {
      bVar3 = QHeaderView::isSectionHidden
                        ((QHeaderView *)
                         (ulong)CONCAT16(in_stack_ffffffffffffff3e,
                                         CONCAT15(in_stack_ffffffffffffff3d,
                                                  CONCAT14(in_stack_ffffffffffffff3c,
                                                           in_stack_ffffffffffffff38))),
                         in_stack_ffffffffffffff34);
    }
    if (bVar3 == false) break;
    local_b4 = local_b4 + -1;
  }
  uVar4 = 0;
  while( true ) {
    bVar3 = false;
    if (local_b0 <= local_b8) {
      bVar3 = QHeaderView::isSectionHidden
                        ((QHeaderView *)
                         CONCAT17(uVar4,(uint7)CONCAT15(in_stack_ffffffffffffff3d,
                                                        CONCAT14(in_stack_ffffffffffffff3c,
                                                                 in_stack_ffffffffffffff38))),
                         in_stack_ffffffffffffff34);
    }
    if (bVar3 == false) break;
    local_b8 = local_b8 + -1;
  }
  if ((local_b4 < local_ac) || (local_b8 < local_b0)) {
    memset(local_18,0,0x10);
    QItemSelectionRange::QItemSelectionRange
              ((QItemSelectionRange *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
    ;
    QItemSelectionRange::operator=
              ((QItemSelectionRange *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    QItemSelectionRange::~QItemSelectionRange
              ((QItemSelectionRange *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))
    ;
  }
  else {
    uVar2 = 0;
    while( true ) {
      bVar3 = QHeaderView::isSectionHidden
                        ((QHeaderView *)
                         CONCAT17(uVar4,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffff3d,
                                                                CONCAT14(in_stack_ffffffffffffff3c,
                                                                         in_stack_ffffffffffffff38))
                                                )),in_stack_ffffffffffffff34);
      in_stack_ffffffffffffff3d = bVar3 && local_ac <= local_b4;
      if (!bVar3 || local_ac > local_b4) break;
      local_ac = local_ac + 1;
    }
    while( true ) {
      bVar3 = QHeaderView::isSectionHidden
                        ((QHeaderView *)
                         CONCAT17(uVar4,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffff3d,
                                                                CONCAT14(in_stack_ffffffffffffff3c,
                                                                         in_stack_ffffffffffffff38))
                                                )),in_stack_ffffffffffffff34);
      in_stack_ffffffffffffff3c = bVar3 && local_b0 <= local_b8;
      if (!bVar3 || local_b0 > local_b8) break;
      local_b0 = local_b0 + 1;
    }
    if ((local_b4 < local_ac) || (local_b8 < local_b0)) {
      memset(local_28,0,0x10);
      QItemSelectionRange::QItemSelectionRange
                ((QItemSelectionRange *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
      QItemSelectionRange::operator=
                ((QItemSelectionRange *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 in_stack_ffffffffffffff18);
      QItemSelectionRange::~QItemSelectionRange
                ((QItemSelectionRange *)
                 CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
    }
    else {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = *(QItemSelectionRange **)(in_RDI + 0x2f8);
      QItemSelectionRange::parent((QItemSelectionRange *)CONCAT44(local_b8,local_b4));
      (**(code **)((pQVar1->tl).d + 0x60))(&local_40,pQVar1,local_b4,local_b8,local_58);
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_60 = &DAT_aaaaaaaaaaaaaaaa;
      topL = *(QModelIndex **)(in_RDI + 0x2f8);
      QItemSelectionRange::parent((QItemSelectionRange *)CONCAT44(local_b8,local_b4));
      (**(code **)(*(long *)topL + 0x60))(&local_70,topL,local_ac,local_b0,local_88);
      QItemSelectionRange::QItemSelectionRange
                ((QItemSelectionRange *)CONCAT44(local_ac,in_stack_ffffffffffffff30),topL,
                 (QModelIndex *)CONCAT44(local_b8,local_b4));
      QItemSelectionRange::operator=((QItemSelectionRange *)CONCAT44(local_b8,local_b4),pQVar1);
      QItemSelectionRange::~QItemSelectionRange((QItemSelectionRange *)CONCAT44(local_b8,local_b4));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableViewPrivate::trimHiddenSelections(QItemSelectionRange *range) const
{
    Q_ASSERT(range && range->isValid());

    int top = range->top();
    int left = range->left();
    int bottom = range->bottom();
    int right = range->right();

    while (bottom >= top && verticalHeader->isSectionHidden(bottom))
        --bottom;
    while (right >= left && horizontalHeader->isSectionHidden(right))
        --right;

    if (top > bottom || left > right) { // everything is hidden
        *range = QItemSelectionRange();
        return;
    }

    while (verticalHeader->isSectionHidden(top) && top <= bottom)
        ++top;
    while (horizontalHeader->isSectionHidden(left) && left <= right)
        ++left;

    if (top > bottom || left > right) { // everything is hidden
        *range = QItemSelectionRange();
        return;
    }

    QModelIndex bottomRight = model->index(bottom, right, range->parent());
    QModelIndex topLeft = model->index(top, left, range->parent());
    *range = QItemSelectionRange(topLeft, bottomRight);
}